

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magnet_uri.cpp
# Opt level: O2

string * __thiscall
libtorrent::make_magnet_uri_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,torrent_handle *handle)

{
  bool bVar1;
  _Base_ptr p_Var2;
  size_t in_RCX;
  _Alloc_hider _Var3;
  span<const_char> in;
  string_view str;
  string_view str_00;
  string_view str_01;
  string local_2d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  sha1_hash local_27c;
  torrent_status st;
  
  bVar1 = torrent_handle::is_valid((torrent_handle *)this);
  if (bVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    torrent_handle::info_hash(&local_27c,(torrent_handle *)this);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    in.m_len = in_RCX;
    in.m_ptr = (char *)0x14;
    aux::to_hex_abi_cxx11_((string *)&st,(aux *)&local_27c,in);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&st);
    torrent_handle::status(&st,(torrent_handle *)this,(status_flags_t)0x40);
    if (st.name._M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      str.len_ = in_RCX;
      str.ptr_ = (char *)st.name._M_string_length;
      escape_string_abi_cxx11_((string *)&local_2b0,(libtorrent *)st.name._M_dataplus._M_p,str);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    torrent_handle::trackers
              ((vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_> *)
               &local_2d0,(torrent_handle *)this);
    for (_Var3._M_p = local_2d0._M_dataplus._M_p; _Var3._M_p != (pointer)local_2d0._M_string_length;
        _Var3._M_p = _Var3._M_p + 0x60) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      str_00.len_ = in_RCX;
      str_00.ptr_ = *(char **)(_Var3._M_p + 8);
      escape_string_abi_cxx11_((string *)&local_2b0,*(libtorrent **)_Var3._M_p,str_00);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    std::vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_>::~vector
              ((vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_> *)
               &local_2d0);
    torrent_handle::url_seeds_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_2b0,(torrent_handle *)this);
    for (p_Var2 = local_2b0._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &local_2b0._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      str_01.len_ = in_RCX;
      str_01.ptr_ = (char *)p_Var2[1]._M_parent;
      escape_string_abi_cxx11_(&local_2d0,*(libtorrent **)(p_Var2 + 1),str_01);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_2d0);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_2b0);
    torrent_status::~torrent_status(&st);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&st);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string make_magnet_uri(torrent_handle const& handle)
	{
		if (!handle.is_valid()) return "";

		std::string ret;
		sha1_hash const& ih = handle.info_hash();
		ret += "magnet:?xt=urn:btih:";
		ret += aux::to_hex(ih);

		torrent_status st = handle.status(torrent_handle::query_name);
		if (!st.name.empty())
		{
			ret += "&dn=";
			ret += escape_string(st.name);
		}

		for (auto const& tr : handle.trackers())
		{
			ret += "&tr=";
			ret += escape_string(tr.url);
		}

		for (auto const& s : handle.url_seeds())
		{
			ret += "&ws=";
			ret += escape_string(s);
		}

		return ret;
	}